

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O2

Data128 Centaurus::pack_charclass(CharClass<char> *cc)

{
  int index;
  int i;
  long lVar1;
  Data128 d128;
  undefined1 auStack_38 [17];
  char acStack_27 [15];
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    index = (int)cc;
    CharClass<char>::operator[]((CharClass<char> *)auStack_38,index);
    if (auStack_38[8] == auStack_38[9]) {
      (acStack_27 + lVar1 * 2 + -1)[0] = -1;
      (acStack_27 + lVar1 * 2 + -1)[1] = '\0';
    }
    else {
      CharClass<char>::operator[]((CharClass<char> *)auStack_38,index);
      acStack_27[lVar1 * 2 + -1] = auStack_38[8];
      CharClass<char>::operator[]((CharClass<char> *)auStack_38,index);
      acStack_27[lVar1 * 2] = auStack_38[9] + -1;
    }
  }
  return stack0xffffffffffffffd8;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<char>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 8; i++)
    {
        if (cc[i].empty())
        {
            d128.ub[i * 2 + 0] = 0xFF;
            d128.ub[i * 2 + 1] = 0;
        }
        else
        {
            d128.ub[i * 2 + 0] = cc[i].start();
            d128.ub[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}